

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

ostream * Gudhi::operator<<(ostream *os,Simplex_tree<Gudhi::Simplex_tree_options_default> *st)

{
  pointer pvVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar2;
  Siblings *pSVar3;
  int iVar4;
  pointer pvVar5;
  ostream *poVar6;
  Filtration_value *pFVar7;
  Siblings *__return_storage_ptr__;
  Vertex_handle VVar8;
  Simplex_handle local_60;
  Simplex_handle local_58 [2];
  int local_48;
  Siblings *local_40;
  int local_38;
  
  Simplex_tree<Gudhi::Simplex_tree_options_default>::maybe_initialize_filtration(st);
  pvVar1 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (st->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    ppVar2 = pvVar5->m_ptr;
    local_58[0].m_ptr = ppVar2;
    iVar4 = Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(st,local_58);
    poVar6 = (ostream *)std::ostream::operator<<(os,iVar4);
    std::operator<<(poVar6," ");
    __return_storage_ptr__ = (Siblings *)(local_58 + 1);
    local_60.m_ptr = ppVar2;
    Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,st,&local_60);
    iVar4 = local_38;
    pSVar3 = local_40;
    VVar8 = local_48;
    while ((__return_storage_ptr__ =
                 (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                    *)&__return_storage_ptr__->oncles_)->m_Begin).sib_,
           __return_storage_ptr__ != pSVar3 || (VVar8 != iVar4))) {
      poVar6 = (ostream *)std::ostream::operator<<(os,VVar8);
      std::operator<<(poVar6," ");
      VVar8 = __return_storage_ptr__->parent_;
    }
    pFVar7 = (Filtration_value *)&ppVar2->second;
    if (ppVar2 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)0x0) {
      pFVar7 = &Simplex_tree<Gudhi::Simplex_tree_options_default>::Filtration_simplex_base_real::
                inf_;
    }
    poVar6 = std::ostream::_M_insert<double>
                       ((((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                           *)pFVar7)->super_Filtration_simplex_base).filt_);
    std::operator<<(poVar6,"\n");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream & os, const Simplex_tree<T...> & st) {
  for (auto sh : st.filtration_simplex_range()) {
    os << st.dimension(sh) << " ";
    for (auto v : st.simplex_vertex_range(sh)) {
      os << v << " ";
    }
    os << st.filtration(sh) << "\n";  // TODO(VR): why adding the key ?? not read ?? << "     " << st.key(sh) << " \n";
  }
  return os;
}